

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O2

ostream * operator<<(ostream *o,Bounds *bounds)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(o,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bounds->lower);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bounds->upper);
  std::operator<<(poVar1,")");
  return o;
}

Assistant:

std::ostream& operator << (std::ostream &o, const Bounds &bounds)
{
	o << "(" << bounds.lower << ", " << bounds.upper << ")";
	return o;
}